

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

key_type * __thiscall
nlohmann::detail::
iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::key(iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      *this)

{
  invalid_iterator *__return_storage_ptr__;
  string local_40;
  
  if (this->m_object == (pointer)0x0) {
    __assert_fail("m_object != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x1455,
                  "const typename object_t::key_type &nlohmann::detail::iter_impl<nlohmann::basic_json<>>::key() const [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  if (this->m_object->m_type == object) {
    return (key_type *)((this->m_it).object_iterator._M_node + 1);
  }
  __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot use key() for non-object iterators","");
  invalid_iterator::create(__return_storage_ptr__,0xcf,&local_40);
  __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
}

Assistant:

const typename object_t::key_type& key() const {
		assert(m_object != nullptr);

		if (JSON_LIKELY(m_object->is_object())) {
			return m_it.object_iterator->first;
		}

		JSON_THROW(invalid_iterator::create(207, "cannot use key() for non-object iterators"));
	}